

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

void __thiscall tinyxml2::StrPair::SetStr(StrPair *this,char *str,int flags)

{
  size_t sVar1;
  char *__dest;
  
  if (((this->_flags & 0x200) != 0) && (this->_start != (char *)0x0)) {
    operator_delete__(this->_start);
  }
  this->_flags = 0;
  this->_start = (char *)0x0;
  this->_end = (char *)0x0;
  sVar1 = strlen(str);
  __dest = (char *)operator_new__(sVar1 + 1);
  this->_start = __dest;
  memcpy(__dest,str,sVar1 + 1);
  this->_end = __dest + sVar1;
  this->_flags = flags | 0x200;
  return;
}

Assistant:

void StrPair::SetStr( const char* str, int flags )
{
    Reset();
    size_t len = strlen( str );
    _start = new char[ len+1 ];
    memcpy( _start, str, len+1 );
    _end = _start + len;
    _flags = flags | NEEDS_DELETE;
}